

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O0

Dec_Edge_t Dec_Factor_rec(Dec_Graph_t *pFForm,Mvc_Cover_t *pCover)

{
  int iVar1;
  Dec_Edge_t DVar2;
  Dec_Edge_t DVar3;
  Mvc_Cover_t *pSimple;
  Dec_Edge_t eNode;
  Dec_Edge_t eNodeAnd;
  Dec_Edge_t eNodeRem;
  Dec_Edge_t eNodeQuo;
  Dec_Edge_t eNodeDiv;
  Mvc_Cover_t *pCom;
  Mvc_Cover_t *pRem;
  Mvc_Cover_t *pQuo;
  Mvc_Cover_t *pDiv;
  Mvc_Cover_t *pCover_local;
  Dec_Graph_t *pFForm_local;
  
  pDiv = pCover;
  pCover_local = (Mvc_Cover_t *)pFForm;
  iVar1 = Mvc_CoverReadCubeNum(pCover);
  if (iVar1 == 0) {
    __assert_fail("Mvc_CoverReadCubeNum(pCover)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/dec/decFactor.c"
                  ,0x73,"Dec_Edge_t Dec_Factor_rec(Dec_Graph_t *, Mvc_Cover_t *)");
  }
  pQuo = Mvc_CoverDivisor(pDiv);
  if (pQuo == (Mvc_Cover_t *)0x0) {
    pFForm_local._4_4_ = Dec_FactorTrivial((Dec_Graph_t *)pCover_local,pDiv);
  }
  else {
    Mvc_CoverDivideInternal(pDiv,pQuo,&pRem,&pCom);
    iVar1 = Mvc_CoverReadCubeNum(pRem);
    if (iVar1 == 0) {
      __assert_fail("Mvc_CoverReadCubeNum(pQuo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/dec/decFactor.c"
                    ,0x7c,"Dec_Edge_t Dec_Factor_rec(Dec_Graph_t *, Mvc_Cover_t *)");
    }
    Mvc_CoverFree(pQuo);
    Mvc_CoverFree(pCom);
    iVar1 = Mvc_CoverReadCubeNum(pRem);
    if (iVar1 == 1) {
      DVar2 = Dec_FactorLF_rec((Dec_Graph_t *)pCover_local,pDiv,pRem);
      Mvc_CoverFree(pRem);
      pFForm_local._4_4_ = DVar2;
    }
    else {
      Mvc_CoverMakeCubeFree(pRem);
      Mvc_CoverDivideInternal(pDiv,pRem,&pQuo,&pCom);
      iVar1 = Mvc_CoverIsCubeFree(pQuo);
      if (iVar1 == 0) {
        pSimple = Mvc_CoverCommonCubeCover(pQuo);
        Mvc_CoverFree(pQuo);
        Mvc_CoverFree(pRem);
        Mvc_CoverFree(pCom);
        DVar2 = Dec_FactorLF_rec((Dec_Graph_t *)pCover_local,pDiv,pSimple);
        Mvc_CoverFree(pSimple);
        pFForm_local._4_4_ = DVar2;
      }
      else {
        DVar2 = Dec_Factor_rec((Dec_Graph_t *)pCover_local,pQuo);
        DVar3 = Dec_Factor_rec((Dec_Graph_t *)pCover_local,pRem);
        Mvc_CoverFree(pQuo);
        Mvc_CoverFree(pRem);
        DVar2 = Dec_GraphAddNodeAnd((Dec_Graph_t *)pCover_local,DVar2,DVar3);
        iVar1 = Mvc_CoverReadCubeNum(pCom);
        if (iVar1 == 0) {
          Mvc_CoverFree(pCom);
          pFForm_local._4_4_ = DVar2;
        }
        else {
          DVar3 = Dec_Factor_rec((Dec_Graph_t *)pCover_local,pCom);
          Mvc_CoverFree(pCom);
          pFForm_local._4_4_ = Dec_GraphAddNodeOr((Dec_Graph_t *)pCover_local,DVar2,DVar3);
        }
      }
    }
  }
  return pFForm_local._4_4_;
}

Assistant:

Dec_Edge_t Dec_Factor_rec( Dec_Graph_t * pFForm, Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pDiv, * pQuo, * pRem, * pCom;
    Dec_Edge_t eNodeDiv, eNodeQuo, eNodeRem;
    Dec_Edge_t eNodeAnd, eNode;

    // make sure the cover contains some cubes
    assert( Mvc_CoverReadCubeNum(pCover) );

    // get the divisor
    pDiv = Mvc_CoverDivisor( pCover );
    if ( pDiv == NULL )
        return Dec_FactorTrivial( pFForm, pCover );

    // divide the cover by the divisor
    Mvc_CoverDivideInternal( pCover, pDiv, &pQuo, &pRem );
    assert( Mvc_CoverReadCubeNum(pQuo) );

    Mvc_CoverFree( pDiv );
    Mvc_CoverFree( pRem );

    // check the trivial case
    if ( Mvc_CoverReadCubeNum(pQuo) == 1 )
    {
        eNode = Dec_FactorLF_rec( pFForm, pCover, pQuo );
        Mvc_CoverFree( pQuo );
        return eNode;
    }

    // make the quotient cube ABC_FREE
    Mvc_CoverMakeCubeFree( pQuo );

    // divide the cover by the quotient
    Mvc_CoverDivideInternal( pCover, pQuo, &pDiv, &pRem );

    // check the trivial case
    if ( Mvc_CoverIsCubeFree( pDiv ) )
    {
        eNodeDiv = Dec_Factor_rec( pFForm, pDiv );
        eNodeQuo = Dec_Factor_rec( pFForm, pQuo );
        Mvc_CoverFree( pDiv );
        Mvc_CoverFree( pQuo );
        eNodeAnd = Dec_GraphAddNodeAnd( pFForm, eNodeDiv, eNodeQuo );
        if ( Mvc_CoverReadCubeNum(pRem) == 0 )
        {
            Mvc_CoverFree( pRem );
            return eNodeAnd;
        }
        else
        {
            eNodeRem = Dec_Factor_rec( pFForm, pRem );
            Mvc_CoverFree( pRem );
            return Dec_GraphAddNodeOr( pFForm, eNodeAnd, eNodeRem );
        }
    }

    // get the common cube
    pCom = Mvc_CoverCommonCubeCover( pDiv );
    Mvc_CoverFree( pDiv );
    Mvc_CoverFree( pQuo );
    Mvc_CoverFree( pRem );

    // solve the simple problem
    eNode = Dec_FactorLF_rec( pFForm, pCover, pCom );
    Mvc_CoverFree( pCom );
    return eNode;
}